

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

Abc_Cex_t * Bmc_CexEssentialBits(Gia_Man_t *p,Abc_Cex_t *pCexState,Abc_Cex_t *pCexCare,int fVerbose)

{
  bool bVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  Gia_Obj_t *pGVar4;
  Abc_Cex_t *pCexPrev;
  uint iBit;
  Abc_Cex_t *pAVar5;
  bool bVar6;
  int fEqual;
  Abc_Cex_t *local_60;
  Abc_Cex_t *local_58;
  int local_4c;
  Gia_Man_t *local_48;
  Abc_Cex_t *local_40;
  Abc_Cex_t *pPrev;
  
  pPrev = (Abc_Cex_t *)0x0;
  fEqual = 0;
  local_4c = fVerbose;
  if (pCexState->nBits != pCexCare->nBits) {
    __assert_fail("pCexState->nBits == pCexCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x2f8,
                  "Abc_Cex_t *Bmc_CexEssentialBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, int)");
  }
  local_60 = pCexState;
  local_40 = Abc_CexAlloc(0,p->vCis->nSize,pCexState->iFrame + 1);
  iVar2 = local_60->iFrame;
  local_40->iPo = local_60->iPo;
  local_40->iFrame = iVar2;
  iBit = 0;
  bVar6 = false;
  pAVar5 = local_60;
  pCexPrev = (Abc_Cex_t *)0x0;
  local_58 = pCexCare;
  local_48 = p;
  do {
    if (pAVar5->nBits <= (int)iBit) {
      Abc_CexFreeP(&pPrev);
      printf("Essentials:   ");
      pAVar5 = local_40;
      Bmc_CexPrint(local_40,p->vCis->nSize - p->nRegs,local_4c);
      return pAVar5;
    }
    pAVar3 = pCexPrev;
    if (((uint)(&pCexCare[1].iPo)[iBit >> 5] >> (iBit & 0x1f) & 1) == 0) goto LAB_0048b40f;
    bVar1 = bVar6;
    if ((int)iBit % pCexCare->nPis < p->vCis->nSize - p->nRegs) {
      pAVar3 = Bmc_CexEssentialBitOne(p,pAVar5,iBit,pCexPrev,&fEqual);
      if (pAVar3 == (Abc_Cex_t *)0x0) {
        pAVar3 = pCexPrev;
        pCexCare = local_58;
        pAVar5 = local_60;
        if ((fEqual != 0) && (bVar1 = true, bVar6)) goto LAB_0048b402;
      }
      else {
        Abc_CexFree(pCexPrev);
        pAVar5 = local_60;
        pPrev = pAVar3;
        pGVar4 = Gia_ManPo(p,local_60->iPo);
        bVar6 = ((undefined1  [12])*pGVar4 & (undefined1  [12])0x4000000000000000) ==
                (undefined1  [12])0x0;
        pGVar4 = Gia_ManPo(local_48,pAVar5->iPo);
        pCexPrev = pAVar3;
        pCexCare = local_58;
        p = local_48;
        bVar1 = bVar6;
        if (((undefined1  [12])*pGVar4 & (undefined1  [12])0x4000000000000000) ==
            (undefined1  [12])0x0) goto LAB_0048b402;
      }
    }
    else {
LAB_0048b402:
      (&local_40[1].iPo)[iBit >> 5] = (&local_40[1].iPo)[iBit >> 5] | 1 << ((byte)iBit & 0x1f);
      pAVar3 = pCexPrev;
      bVar6 = bVar1;
    }
LAB_0048b40f:
    iBit = iBit + 1;
    pCexPrev = pAVar3;
  } while( true );
}

Assistant:

Abc_Cex_t * Bmc_CexEssentialBits( Gia_Man_t * p, Abc_Cex_t * pCexState, Abc_Cex_t * pCexCare, int fVerbose )
{
    Abc_Cex_t * pNew, * pTemp, * pPrev = NULL;
    int b, fEqual = 0, fPrevStatus = 0;
//    abctime clk = Abc_Clock();
    assert( pCexState->nBits == pCexCare->nBits );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // iterate through care-bits
    for ( b = 0; b < pCexState->nBits; b++ )
    {
        // skip don't-care bits
        if ( !Abc_InfoHasBit(pCexCare->pData, b) )
            continue;

        // skip state bits
        if ( b % pCexCare->nPis >= Gia_ManPiNum(p) )
        {
            Abc_InfoSetBit( pNew->pData, b );
            continue;
        }

        // check if this is an essential bit
        pTemp = Bmc_CexEssentialBitOne( p, pCexState, b, pPrev, &fEqual );
//        pTemp = Bmc_CexEssentialBitOne( p, pCexState, b, NULL, &fEqual );
        if ( pTemp == NULL )
        {
            if ( fEqual && fPrevStatus )
                Abc_InfoSetBit( pNew->pData, b );
            continue;
        }
//        Bmc_CexPrint( pTemp, Gia_ManPiNum(p), fVerbose );
        Abc_CexFree( pPrev );
        pPrev = pTemp;

        // record essential bit
        fPrevStatus = !Gia_ManPo(p, pCexState->iPo)->fMark1;
        if ( !Gia_ManPo(p, pCexState->iPo)->fMark1 )
            Abc_InfoSetBit( pNew->pData, b );
    }
    Abc_CexFreeP( &pPrev );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    printf( "Essentials:   " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    return pNew;
}